

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O3

double __thiscall embree::BVHNStatistics<4>::Statistics::LeafStat::sah(LeafStat *this,BVH *bvh)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar4 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[0];
  fVar5 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[1] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[1];
  fVar6 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[2] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[2];
  fVar1 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[0];
  fVar2 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[1] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[1];
  fVar3 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[2] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[2];
  fVar7 = fVar1 - fVar4;
  fVar8 = fVar2 - fVar5;
  fVar9 = fVar3 - fVar6;
  fVar2 = fVar2 - fVar5;
  fVar3 = fVar3 - fVar6;
  fVar1 = fVar1 - fVar4;
  return this->leafSAH /
         (double)(fVar1 * fVar9 * 0.33333334 + (fVar4 * fVar9 + fVar6 * fVar1) * 0.5 + fVar6 * fVar4
                 + fVar3 * fVar8 * 0.33333334 +
                   (fVar6 * fVar8 + fVar5 * fVar3) * 0.5 + fVar5 * fVar6 +
                   fVar2 * fVar7 * 0.33333334 +
                   (fVar5 * fVar7 + fVar4 * fVar2) * 0.5 + fVar4 * fVar5);
}

Assistant:

double sah(BVH* bvh) const {
          return leafSAH/bvh->getLinearBounds().expectedHalfArea();
        }